

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::reportExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,ITransientExpression *expr,
          bool negated)

{
  _func_int **pp_Var1;
  ITransientExpression *pIVar2;
  size_type sVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  undefined7 uVar6;
  undefined4 in_EDX;
  RunContext *in_RSI;
  AssertionResultData *in_RDI;
  byte in_R8B;
  AssertionResult assertionResult;
  AssertionResultData data;
  undefined4 in_stack_fffffffffffffeb8;
  AssertionResult *this_00;
  LazyExpression *in_stack_fffffffffffffed0;
  OfType in_stack_fffffffffffffedc;
  AssertionResultData *in_stack_fffffffffffffee0;
  undefined1 local_21;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar7;
  
  local_21 = in_R8B & 1;
  *(undefined4 *)&in_RDI[5].message.field_2 = *(undefined4 *)&in_RSI->m_context;
  pp_Var1 = (in_RSI->super_IResultCapture)._vptr_IResultCapture;
  pIVar2 = (ITransientExpression *)(in_RSI->super_IRunner)._vptr_IRunner;
  _Var5 = (in_RSI->m_runInfo).name._M_dataplus;
  uVar6 = *(undefined7 *)&(in_RSI->m_runInfo).name.field_0x1;
  sVar3 = (in_RSI->m_runInfo).name._M_string_length;
  sVar4 = *(size_type *)((long)&(in_RSI->m_runInfo).name.field_2 + 8);
  *(size_type *)&in_RDI[5].message = (in_RSI->m_runInfo).name.field_2._M_allocated_capacity;
  in_RDI[5].message._M_string_length = sVar4;
  in_RDI[4].lazyExpression.m_isNegated = (bool)_Var5;
  *(undefined7 *)&in_RDI[4].lazyExpression.field_0x9 = uVar6;
  *(size_type *)&in_RDI[4].resultType = sVar3;
  *(_func_int ***)((long)&in_RDI[4].reconstructedExpression.field_2 + 8) = pp_Var1;
  in_RDI[4].lazyExpression.m_transientExpression = pIVar2;
  this_00 = (AssertionResult *)&stack0xffffffffffffff70;
  uVar7 = in_EDX;
  LazyExpression::LazyExpression((LazyExpression *)this_00,(bool)local_21);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
  AssertionResult::AssertionResult
            (this_00,(AssertionInfo *)CONCAT44(in_EDX,in_stack_fffffffffffffeb8),in_RDI);
  assertionEnded(in_RSI,(AssertionResult *)CONCAT44(uVar7,in_stack_ffffffffffffffe8));
  AssertionResult::~AssertionResult((AssertionResult *)0x1405a7);
  AssertionResultData::~AssertionResultData(in_RDI);
  return;
}

Assistant:

void RunContext::reportExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            ITransientExpression const *expr,
            bool negated ) {

        m_lastAssertionInfo = info;
        AssertionResultData data( resultType, LazyExpression( negated ) );

        AssertionResult assertionResult{ info, data };
        assertionResult.m_resultData.lazyExpression.m_transientExpression = expr;

        assertionEnded( assertionResult );
    }